

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxkbcommon.cpp
# Opt level: O1

void QXkbCommon::setXkbContext(QPlatformInputContext *inputContext,xkb_context *context)

{
  int iVar1;
  byte bVar2;
  long in_RSI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QStringView QVar3;
  QLatin1String QVar4;
  char *normalizedSignature;
  char *inputContextClassName;
  QMetaMethodArgument local_48;
  char *local_30;
  char *local_28;
  undefined1 local_20 [8];
  QObject *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != 0 && in_RDI != (QObject *)0x0) {
    local_28 = "QComposeInputContext";
    local_30 = "setXkbContext(xkb_context*)";
    local_18 = in_RDI;
    QObject::objectName();
    bVar2 = 1;
    if ((undefined1 *)local_48.data == (undefined1 *)0x14) {
      QVar3.m_data = (storage_type_conflict *)local_48.name;
      QVar3.m_size = 0x14;
      QVar4.m_data = "QComposeInputContext";
      QVar4.m_size = 0x14;
      bVar2 = QtPrivate::equalStrings(QVar3,QVar4);
      bVar2 = bVar2 ^ 1;
    }
    if (local_48.metaType != (InterfaceType *)0x0) {
      LOCK();
      *(int *)local_48.metaType = *(int *)local_48.metaType + -1;
      iVar1._0_2_ = (local_48.metaType)->revision;
      iVar1._2_2_ = (local_48.metaType)->alignment;
      UNLOCK();
      if (iVar1 == 0) {
        QArrayData::deallocate((QArrayData *)local_48.metaType,2,0x10);
      }
    }
    if (bVar2 == 0) {
      if (setXkbContext(QPlatformInputContext*,xkb_context*)::setXkbContext == '\0') {
        setXkbContext();
      }
      if (setXkbContext::setXkbContext.mobj != (QMetaObject *)0x0) {
        local_48.metaType = &QtPrivate::QMetaTypeInterfaceWrapper<xkb_context_*>::metaType;
        local_48.name = "struct xkb_context*";
        local_48.data = local_20;
        QMetaMethod::invoke<QMetaMethodArgument>
                  (&setXkbContext::setXkbContext,local_18,DirectConnection,&local_48);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXkbCommon::setXkbContext(QPlatformInputContext *inputContext, struct xkb_context *context)
{
    if (!inputContext || !context)
        return;

    const char *const inputContextClassName = "QComposeInputContext";
    const char *const normalizedSignature = "setXkbContext(xkb_context*)";

    if (inputContext->objectName() != QLatin1StringView(inputContextClassName))
        return;

    static const QMetaMethod setXkbContext = [&]() {
        int methodIndex = inputContext->metaObject()->indexOfMethod(normalizedSignature);
        QMetaMethod method = inputContext->metaObject()->method(methodIndex);
        Q_ASSERT(method.isValid());
        if (!method.isValid())
            qCWarning(lcQpaKeyMapper) << normalizedSignature << "not found on" << inputContextClassName;
        return method;
    }();

    if (!setXkbContext.isValid())
        return;

    setXkbContext.invoke(inputContext, Qt::DirectConnection, Q_ARG(struct xkb_context*, context));
}